

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestReadCustomFilesCommand.h
# Opt level: O0

cmCommand * __thiscall cmCTestReadCustomFilesCommand::Clone(cmCTestReadCustomFilesCommand *this)

{
  cmCommand *this_00;
  cmCTestReadCustomFilesCommand *ni;
  cmCTestReadCustomFilesCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x60);
  cmCTestReadCustomFilesCommand((cmCTestReadCustomFilesCommand *)this_00);
  this_00[1].super_cmObject._vptr_cmObject = (_func_int **)(this->super_cmCTestCommand).CTest;
  return this_00;
}

Assistant:

virtual cmCommand* Clone()
    {
    cmCTestReadCustomFilesCommand* ni = new cmCTestReadCustomFilesCommand;
    ni->CTest = this->CTest;
    return ni;
    }